

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dlerror.c
# Opt level: O2

int run_test_dlerror(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uStackY_50;
  char *pcVar6;
  char *pcVar7;
  undefined8 uVar8;
  int64_t eval_b;
  int64_t eval_a;
  uv_lib_t local_18;
  
  local_18.handle = (void *)0x0;
  local_18.errmsg = (char *)0x0;
  pcVar2 = uv_dlerror(&local_18);
  if (pcVar2 == (char *)0x0) {
    pcVar5 = "!=";
    pcVar7 = "!=";
    uVar8 = 0;
    pcVar2 = (char *)0x0;
    pcVar6 = "NULL";
    pcVar3 = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar4 = "msg";
    uStackY_50 = 0x25;
  }
  else {
    pcVar2 = strstr(pcVar2,"no error");
    if (pcVar2 == (char *)0x0) {
      pcVar5 = "!=";
      pcVar7 = "!=";
      uVar8 = 0;
      pcVar2 = (char *)0x0;
      pcVar6 = "NULL";
      pcVar3 = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
      pcVar4 = "strstr(msg, dlerror_no_error)";
      uStackY_50 = 0x26;
    }
    else {
      iVar1 = uv_dlopen("test/fixtures/load_error.node",&local_18);
      pcVar2 = (char *)(long)iVar1;
      if (pcVar2 == (char *)0xffffffffffffffff) {
        pcVar2 = uv_dlerror(&local_18);
        if (pcVar2 == (char *)0x0) {
          pcVar5 = "!=";
          pcVar7 = "!=";
          uVar8 = 0;
          pcVar2 = (char *)0x0;
          pcVar6 = "NULL";
          pcVar3 = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
          pcVar4 = "msg";
          uStackY_50 = 0x2c;
        }
        else {
          pcVar3 = strstr(pcVar2,"Dynamic loading not supported");
          if (pcVar3 == (char *)0x0) {
            pcVar3 = strstr(pcVar2,"test/fixtures/load_error.node");
            if (pcVar3 == (char *)0x0) {
              pcVar5 = "!=";
              pcVar7 = "!=";
              uVar8 = 0;
              pcVar2 = (char *)0x0;
              pcVar6 = "NULL";
              pcVar3 = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
              pcVar4 = "strstr(msg, path)";
              uStackY_50 = 0x30;
              goto LAB_00117d60;
            }
          }
          pcVar2 = strstr(pcVar2,"no error");
          if (pcVar2 == (char *)0x0) {
            pcVar2 = uv_dlerror(&local_18);
            if (pcVar2 == (char *)0x0) {
              pcVar5 = "!=";
              pcVar7 = "!=";
              uVar8 = 0;
              pcVar2 = (char *)0x0;
              pcVar6 = "NULL";
              pcVar3 = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
              pcVar4 = "msg";
              uStackY_50 = 0x36;
            }
            else {
              pcVar3 = strstr(pcVar2,"Dynamic loading not supported");
              if (pcVar3 == (char *)0x0) {
                pcVar3 = strstr(pcVar2,"test/fixtures/load_error.node");
                if (pcVar3 == (char *)0x0) {
                  pcVar5 = "!=";
                  pcVar7 = "!=";
                  uVar8 = 0;
                  pcVar2 = (char *)0x0;
                  pcVar6 = "NULL";
                  pcVar3 = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
                  pcVar4 = "strstr(msg, path)";
                  uStackY_50 = 0x3a;
                  goto LAB_00117d60;
                }
              }
              pcVar2 = strstr(pcVar2,"no error");
              if (pcVar2 == (char *)0x0) {
                uv_dlclose(&local_18);
                return 0;
              }
              pcVar5 = "==";
              pcVar7 = "==";
              uVar8 = 0;
              pcVar6 = "NULL";
              pcVar3 = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
              pcVar4 = "strstr(msg, dlerror_no_error)";
              uStackY_50 = 0x3c;
            }
          }
          else {
            pcVar5 = "==";
            pcVar7 = "==";
            uVar8 = 0;
            pcVar6 = "NULL";
            pcVar3 = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
            pcVar4 = "strstr(msg, dlerror_no_error)";
            uStackY_50 = 0x32;
          }
        }
      }
      else {
        uVar8 = 0xffffffffffffffff;
        pcVar5 = "==";
        pcVar7 = "==";
        pcVar6 = "-1";
        pcVar3 = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
        pcVar4 = "r";
        uStackY_50 = 0x29;
      }
    }
  }
LAB_00117d60:
  fprintf(_stderr,pcVar3,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-dlerror.c"
          ,uStackY_50,pcVar4,pcVar5,pcVar6,pcVar2,pcVar7,uVar8);
  abort();
}

Assistant:

TEST_IMPL(dlerror) {
  const char* path = "test/fixtures/load_error.node";
  const char* dlerror_no_error = "no error";
  const char* msg;
  uv_lib_t lib;
  int r;

  lib.errmsg = NULL;
  lib.handle = NULL;
  msg = uv_dlerror(&lib);
  ASSERT_NOT_NULL(msg);
  ASSERT_NOT_NULL(strstr(msg, dlerror_no_error));

  r = uv_dlopen(path, &lib);
  ASSERT_EQ(r, -1);

  msg = uv_dlerror(&lib);
  ASSERT_NOT_NULL(msg);
#if !defined(__OpenBSD__) && !defined(__QNX__)
  /* musl's libc.a does not support dlopen(), only libc.so does. */
  if (NULL == strstr(msg, "Dynamic loading not supported"))
    ASSERT_NOT_NULL(strstr(msg, path));
#endif
  ASSERT_NULL(strstr(msg, dlerror_no_error));

  /* Should return the same error twice in a row. */
  msg = uv_dlerror(&lib);
  ASSERT_NOT_NULL(msg);
#if !defined(__OpenBSD__) && !defined(__QNX__)
  /* musl's libc.a does not support dlopen(), only libc.so does. */
  if (NULL == strstr(msg, "Dynamic loading not supported"))
    ASSERT_NOT_NULL(strstr(msg, path));
#endif
  ASSERT_NULL(strstr(msg, dlerror_no_error));

  uv_dlclose(&lib);

  return 0;
}